

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  int iVar1;
  undefined4 uStack_26;
  ushort uStack_22;
  
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset(&this->parser_);
  (this->cursor_visitor_).event_.event_type_ = null_value;
  (this->cursor_visitor_).event_.tag_ = none;
  *(undefined4 *)&(this->cursor_visitor_).event_.field_0x2 = uStack_26;
  *(uint *)&(this->cursor_visitor_).event_.field_0x6 = (uint)uStack_22;
  *(undefined4 *)((long)&(this->cursor_visitor_).event_.ext_tag_ + 2) = 0;
  *(undefined4 *)((long)&(this->cursor_visitor_).event_.ext_tag_ + 6) = 0;
  (this->cursor_visitor_).event_.value_.int64_value_ = 0;
  (this->cursor_visitor_).event_.length_ = 0;
  (this->cursor_visitor_).state_ = 0;
  (this->cursor_visitor_).data_.type_ = 0;
  (this->cursor_visitor_).data_.data_.uint8_data_ = (uint8_t *)0x0;
  (this->cursor_visitor_).data_.size_ = 0;
  (this->cursor_visitor_).shape_.data_ = (pointer)0x0;
  (this->cursor_visitor_).shape_.size_ = 0;
  *(undefined8 *)((long)&(this->cursor_visitor_).shape_.size_ + 1) = 0;
  *(undefined8 *)((long)&(this->cursor_visitor_).index_ + 1) = 0;
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(this);
  if ((char)iVar1 != '\0') {
    return;
  }
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(this);
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }